

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O2

ssize_t get_argument(archive_string *as,char *p)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  as->length = 0;
  pcVar4 = p + -1;
  do {
    cVar1 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
  } while (cVar1 == ' ');
  do {
    if (cVar1 == '\"') {
      pcVar5 = pcVar4 + 1;
LAB_00490bba:
      pcVar2 = pcVar5;
      cVar1 = *pcVar2;
      if (cVar1 == '\\') break;
      if ((cVar1 != '\0') && (pcVar3 = (char *)0x1, cVar1 != '\"')) goto LAB_00490be2;
      pcVar5 = pcVar2 + (1 - (long)pcVar4);
      if (cVar1 != '\"') {
        pcVar5 = (char *)0xffffffffffffffe7;
      }
      if ((long)pcVar5 < 0) {
        return -0x19;
      }
    }
    else {
      if (cVar1 == '\\') {
        cVar1 = pcVar4[1];
        pcVar5 = (char *)0x2;
        if (cVar1 == '\0') {
          pcVar4 = pcVar4 + 1;
          goto LAB_00490c31;
        }
      }
      else if ((cVar1 == '\0') || (pcVar5 = (char *)0x1, cVar1 == ' ')) {
LAB_00490c31:
        return (ssize_t)(pcVar4 + -(long)p);
      }
      archive_strappend_char(as,cVar1);
    }
    cVar1 = pcVar4[(long)pcVar5];
    pcVar4 = pcVar4 + (long)pcVar5;
  } while( true );
  cVar1 = pcVar2[1];
  pcVar5 = pcVar2 + 1;
  pcVar3 = (char *)0x2;
  if (cVar1 != '\0') {
LAB_00490be2:
    archive_strappend_char(as,cVar1);
    pcVar5 = pcVar2 + (long)pcVar3;
  }
  goto LAB_00490bba;
}

Assistant:

static ssize_t
get_argument(struct archive_string *as, const char *p)
{
	const char *s = p;

	archive_string_empty(as);

	/* Skip beginning space characters. */
	while (*s != '\0' && *s == ' ')
		s++;
	/* Copy non-space characters. */
	while (*s != '\0' && *s != ' ') {
		if (*s == '\\') {
			if (s[1] != '\0') {
				archive_strappend_char(as, s[1]);
				s += 2;
			} else {
				s++;/* Ignore this character.*/
				break;
			}
		} else if (*s == '"') {
			ssize_t q = extract_quotation(as, s);
			if (q < 0)
				return (ARCHIVE_FAILED);/* Invalid sequence. */
			s += q;
		} else {
			archive_strappend_char(as, s[0]);
			s++;
		}
	}
	return ((ssize_t)(s - p));
}